

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_function_call(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                      lyxp_set *set,int options)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 *puVar4;
  lyxp_set *plVar5;
  LY_ERR *pLVar6;
  ushort uVar7;
  uint16_t uVar8;
  ulong uVar9;
  char *pcVar10;
  code *local_58;
  undefined8 *local_48;
  
  uVar7 = *exp_idx;
  if (set == (lyxp_set *)0x0) {
    local_58 = (code *)0x0;
  }
  else {
    pcVar10 = exp->expr;
    uVar9 = (ulong)exp->expr_pos[uVar7];
    switch(exp->tok_len[uVar7]) {
    case '\x03':
      if (pcVar10[uVar9] == 's') {
        if ((pcVar10[uVar9 + 1] != 'u') || (pcVar10[uVar9 + 2] != 'm'))
        goto switchD_0016bdaa_caseD_e;
        local_58 = xpath_sum;
      }
      else {
        if (((pcVar10[uVar9] != 'n') || (pcVar10[uVar9 + 1] != 'o')) || (pcVar10[uVar9 + 2] != 't'))
        goto switchD_0016bdaa_caseD_e;
        local_58 = xpath_not;
      }
      break;
    case '\x04':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"lang",4);
      if (iVar2 == 0) {
        local_58 = xpath_lang;
      }
      else {
        iVar2 = strncmp(pcVar3,"last",4);
        if (iVar2 == 0) {
          local_58 = xpath_last;
        }
        else {
          iVar2 = strncmp(pcVar3,"name",4);
          if (iVar2 == 0) {
            local_58 = xpath_name;
          }
          else {
            iVar2 = strncmp(pcVar3,"true",4);
            if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
            local_58 = xpath_true;
          }
        }
      }
      break;
    case '\x05':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"count",5);
      if (iVar2 == 0) {
        local_58 = xpath_count;
      }
      else {
        iVar2 = strncmp(pcVar3,"false",5);
        if (iVar2 == 0) {
          local_58 = xpath_false;
        }
        else {
          iVar2 = strncmp(pcVar3,"floor",5);
          if (iVar2 == 0) {
            local_58 = xpath_floor;
          }
          else {
            iVar2 = strncmp(pcVar3,"round",5);
            if (iVar2 == 0) {
              local_58 = xpath_round;
            }
            else {
              iVar2 = strncmp(pcVar3,"deref",5);
              if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
              local_58 = xpath_deref;
            }
          }
        }
      }
      break;
    case '\x06':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"concat",6);
      if (iVar2 == 0) {
        local_58 = xpath_concat;
      }
      else {
        iVar2 = strncmp(pcVar3,"number",6);
        if (iVar2 == 0) {
          local_58 = xpath_number;
        }
        else {
          iVar2 = strncmp(pcVar3,"string",6);
          if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
          local_58 = xpath_string;
        }
      }
      break;
    case '\a':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"boolean",7);
      if (iVar2 == 0) {
        local_58 = xpath_boolean;
      }
      else {
        iVar2 = strncmp(pcVar3,"ceiling",7);
        if (iVar2 == 0) {
          local_58 = xpath_ceiling;
        }
        else {
          iVar2 = strncmp(pcVar3,"current",7);
          if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
          local_58 = xpath_current;
        }
      }
      break;
    case '\b':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"contains",8);
      if (iVar2 == 0) {
        local_58 = xpath_contains;
      }
      else {
        iVar2 = strncmp(pcVar3,"position",8);
        if (iVar2 == 0) {
          local_58 = xpath_position;
        }
        else {
          iVar2 = strncmp(pcVar3,"re-match",8);
          if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
          local_58 = xpath_re_match;
        }
      }
      break;
    case '\t':
      iVar2 = strncmp(pcVar10 + uVar9,"substring",9);
      if (iVar2 == 0) {
        local_58 = xpath_substring;
      }
      else {
        iVar2 = strncmp(pcVar10 + uVar9,"translate",9);
        if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
        local_58 = xpath_translate;
      }
      break;
    case '\n':
      pcVar3 = pcVar10 + uVar9;
      iVar2 = strncmp(pcVar3,"local-name",10);
      if (iVar2 == 0) {
        local_58 = xpath_local_name;
      }
      else {
        iVar2 = strncmp(pcVar3,"enum-value",10);
        if (iVar2 == 0) {
          local_58 = xpath_enum_value;
        }
        else {
          iVar2 = strncmp(pcVar3,"bit-is-set",10);
          if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
          local_58 = xpath_bit_is_set;
        }
      }
      break;
    case '\v':
      iVar2 = strncmp(pcVar10 + uVar9,"starts-with",0xb);
      if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
      local_58 = xpath_starts_with;
      break;
    case '\f':
      iVar2 = strncmp(pcVar10 + uVar9,"derived-from",0xc);
      if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
      local_58 = xpath_derived_from;
      break;
    case '\r':
      iVar2 = strncmp(pcVar10 + uVar9,"namespace-uri",0xd);
      if (iVar2 == 0) {
        local_58 = xpath_namespace_uri;
      }
      else {
        iVar2 = strncmp(pcVar10 + uVar9,"string-length",0xd);
        if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
        local_58 = xpath_string_length;
      }
      break;
    default:
switchD_0016bdaa_caseD_e:
      ly_vlog(LYE_XPATH_INTOK,LY_VLOG_NONE,(void *)0x0,"Unknown",pcVar10 + uVar9);
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Unknown XPath function \"%.*s\".",
              (ulong)exp->tok_len[*exp_idx],exp->expr + exp->expr_pos[*exp_idx]);
      return -1;
    case '\x0f':
      iVar2 = strncmp(pcVar10 + uVar9,"normalize-space",0xf);
      if (iVar2 == 0) {
        local_58 = xpath_normalize_space;
      }
      else {
        iVar2 = strncmp(pcVar10 + uVar9,"substring-after",0xf);
        if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
        local_58 = xpath_substring_after;
      }
      break;
    case '\x10':
      iVar2 = strncmp(pcVar10 + uVar9,"substring-before",0x10);
      if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
      local_58 = xpath_substring_before;
      break;
    case '\x14':
      iVar2 = strncmp(pcVar10 + uVar9,"derived-from-or-self",0x14);
      if (iVar2 != 0) goto switchD_0016bdaa_caseD_e;
      local_58 = xpath_derived_from_or_self;
    }
  }
  if ('\x02' < ly_log_level) {
    pcVar10 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar10 = "skipped";
    }
    pcVar3 = print_token(exp->tokens[uVar7]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar10,pcVar3,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar7 = *exp_idx;
  }
  uVar8 = uVar7 + 1;
  *exp_idx = uVar8;
  if ('\x02' < ly_log_level) {
    pcVar10 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar10 = "skipped";
    }
    pcVar3 = print_token(exp->tokens[uVar8]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar10,pcVar3,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar8 = *exp_idx;
  }
  *exp_idx = uVar8 + 1;
  if (exp->tokens[(ushort)(uVar8 + 1)] == LYXP_TOKEN_PAR2) {
    iVar2 = 1;
    uVar7 = 0;
    local_48 = (undefined8 *)0x0;
LAB_0016c476:
    uVar9 = (ulong)*exp_idx;
    if (*exp_idx < exp->used) {
      pcVar10 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar10 = "skipped";
      }
      do {
        uVar8 = (uint16_t)uVar9;
        if (exp->tokens[uVar9] != LYXP_TOKEN_COMMA) break;
        if ('\x02' < ly_log_level) {
          ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar10,",",
                     (ulong)exp->expr_pos[uVar9]);
          uVar8 = *exp_idx;
        }
        *exp_idx = uVar8 + 1;
        if (set == (lyxp_set *)0x0) {
          iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
        }
        else {
          uVar1 = uVar7 + 1;
          puVar4 = (undefined8 *)realloc(local_48,(ulong)((uint)uVar1 * 8));
          if (puVar4 == (undefined8 *)0x0) {
            pLVar6 = ly_errno_location();
            *pLVar6 = LY_EMEM;
            ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
            goto LAB_0016c717;
          }
          plVar5 = set_copy(set);
          puVar4[(ulong)(uint)uVar1 - 1] = plVar5;
          local_48 = puVar4;
          uVar7 = uVar1;
          if (plVar5 == (lyxp_set *)0x0) goto LAB_0016c717;
          iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,plVar5,options);
        }
        if (iVar2 != 0) goto LAB_0016c717;
        uVar9 = (ulong)*exp_idx;
        iVar2 = 0;
      } while (*exp_idx < exp->used);
    }
    uVar8 = (uint16_t)uVar9;
    if ('\x02' < ly_log_level) {
      pcVar10 = "parsed";
      if (set == (lyxp_set *)0x0) {
        pcVar10 = "skipped";
      }
      pcVar3 = print_token(exp->tokens[uVar9]);
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_function_call",pcVar10,pcVar3,
                 (ulong)exp->expr_pos[*exp_idx]);
      uVar8 = *exp_idx;
    }
    *exp_idx = uVar8 + 1;
    if (set == (lyxp_set *)0x0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*local_58)(local_48,uVar7,cur_node,param_4,set,options);
    }
LAB_0016c717:
    if (uVar7 == 0) goto LAB_0016c73d;
  }
  else {
    if (set == (lyxp_set *)0x0) {
      iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
      if (iVar2 != 0) {
        local_48 = (undefined8 *)0x0;
        goto LAB_0016c73d;
      }
      uVar7 = 0;
      local_48 = (undefined8 *)0x0;
LAB_0016c7d5:
      iVar2 = 0;
      goto LAB_0016c476;
    }
    local_48 = (undefined8 *)malloc(8);
    if (local_48 == (undefined8 *)0x0) {
      pLVar6 = ly_errno_location();
      *pLVar6 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_function_call");
      local_48 = (undefined8 *)0x0;
      iVar2 = 1;
      goto LAB_0016c73d;
    }
    plVar5 = set_copy(set);
    *local_48 = plVar5;
    if (plVar5 == (lyxp_set *)0x0) {
      iVar2 = 1;
      uVar7 = 1;
    }
    else {
      iVar2 = eval_expr(exp,exp_idx,cur_node,param_4,plVar5,options);
      uVar7 = 1;
      if (iVar2 == 0) goto LAB_0016c7d5;
    }
  }
  uVar9 = 0;
  do {
    lyxp_set_free((lyxp_set *)local_48[uVar9]);
    uVar9 = uVar9 + 1;
  } while (uVar7 != uVar9);
LAB_0016c73d:
  free(local_48);
  return iVar2;
}

Assistant:

static int
eval_function_call(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                   struct lyxp_set *set, int options)
{
    int rc = EXIT_FAILURE;
    int (*xpath_func)(struct lyxp_set **, uint16_t, struct lyd_node *, struct lys_module *, struct lyxp_set *, int) = NULL;
    uint16_t arg_count = 0, i;
    struct lyxp_set **args = NULL, **args_aux;

    if (set) {
        /* FunctionName */
        switch (exp->tok_len[*exp_idx]) {
        case 3:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "not", 3)) {
                xpath_func = &xpath_not;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "sum", 3)) {
                xpath_func = &xpath_sum;
            }
            break;
        case 4:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "lang", 4)) {
                xpath_func = &xpath_lang;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "last", 4)) {
                xpath_func = &xpath_last;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "name", 4)) {
                xpath_func = &xpath_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "true", 4)) {
                xpath_func = &xpath_true;
            }
            break;
        case 5:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "count", 5)) {
                xpath_func = &xpath_count;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "false", 5)) {
                xpath_func = &xpath_false;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "floor", 5)) {
                xpath_func = &xpath_floor;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "round", 5)) {
                xpath_func = &xpath_round;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "deref", 5)) {
                xpath_func = &xpath_deref;
            }
            break;
        case 6:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "concat", 6)) {
                xpath_func = &xpath_concat;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "number", 6)) {
                xpath_func = &xpath_number;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string", 6)) {
                xpath_func = &xpath_string;
            }
            break;
        case 7:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "boolean", 7)) {
                xpath_func = &xpath_boolean;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "ceiling", 7)) {
                xpath_func = &xpath_ceiling;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "current", 7)) {
                xpath_func = &xpath_current;
            }
            break;
        case 8:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "contains", 8)) {
                xpath_func = &xpath_contains;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "position", 8)) {
                xpath_func = &xpath_position;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "re-match", 8)) {
                xpath_func = &xpath_re_match;
            }
            break;
        case 9:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring", 9)) {
                xpath_func = &xpath_substring;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "translate", 9)) {
                xpath_func = &xpath_translate;
            }
            break;
        case 10:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "local-name", 10)) {
                xpath_func = &xpath_local_name;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "enum-value", 10)) {
                xpath_func = &xpath_enum_value;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "bit-is-set", 10)) {
                xpath_func = &xpath_bit_is_set;
            }
            break;
        case 11:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "starts-with", 11)) {
                xpath_func = &xpath_starts_with;
            }
            break;
        case 12:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from", 12)) {
                xpath_func = &xpath_derived_from;
            }
            break;
        case 13:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "namespace-uri", 13)) {
                xpath_func = &xpath_namespace_uri;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "string-length", 13)) {
                xpath_func = &xpath_string_length;
            }
            break;
        case 15:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "normalize-space", 15)) {
                xpath_func = &xpath_normalize_space;
            } else if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-after", 15)) {
                xpath_func = &xpath_substring_after;
            }
            break;
        case 16:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "substring-before", 16)) {
                xpath_func = &xpath_substring_before;
            }
            break;
        case 20:
            if (!strncmp(&exp->expr[exp->expr_pos[*exp_idx]], "derived-from-or-self", 20)) {
                xpath_func = &xpath_derived_from_or_self;
            }
            break;
        }

        if (!xpath_func) {
            LOGVAL(LYE_XPATH_INTOK, LY_VLOG_NONE, NULL, "Unknown", &exp->expr[exp->expr_pos[*exp_idx]]);
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL,
                   "Unknown XPath function \"%.*s\".", exp->tok_len[*exp_idx], &exp->expr[exp->expr_pos[*exp_idx]]);
            return -1;
        }
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* '(' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    /* ( Expr ( ',' Expr )* )? */
    if (exp->tokens[*exp_idx] != LYXP_TOKEN_PAR2) {
        if (set) {
            args = malloc(sizeof *args);
            if (!args) {
                LOGMEM;
                goto cleanup;
            }
            arg_count = 1;
            args[0] = set_copy(set);
            if (!args[0]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[0], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }
    while ((exp->used > *exp_idx) && (exp->tokens[*exp_idx] == LYXP_TOKEN_COMMA)) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        if (set) {
            ++arg_count;
            args_aux = realloc(args, arg_count * sizeof *args);
            if (!args_aux) {
                arg_count--;
                LOGMEM;
                goto cleanup;
            }
            args = args_aux;
            args[arg_count - 1] = set_copy(set);
            if (!args[arg_count - 1]) {
                goto cleanup;
            }

            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, args[arg_count - 1], options))) {
                goto cleanup;
            }
        } else {
            if ((rc = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options))) {
                goto cleanup;
            }
        }
    }

    /* ')' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (set) {
        /* evaluate function */
        rc = xpath_func(args, arg_count, cur_node, local_mod, set, options);
    } else {
        rc = EXIT_SUCCESS;
    }

cleanup:
    for (i = 0; i < arg_count; ++i) {
        lyxp_set_free(args[i]);
    }
    free(args);

    return rc;
}